

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug_info.h
# Opt level: O0

uint64_t __thiscall
bloaty::dwarf::CompilationUnitSizes::ReadDWARFOffset(CompilationUnitSizes *this,string_view *data)

{
  uint uVar1;
  string_view *in_RSI;
  long in_RDI;
  undefined8 local_18;
  
  if ((*(byte *)(in_RDI + 2) & 1) == 0) {
    uVar1 = ReadFixed<unsigned_int,4ul>(in_RSI);
    local_18 = (unsigned_long)uVar1;
  }
  else {
    local_18 = ReadFixed<unsigned_long,8ul>(in_RSI);
  }
  return local_18;
}

Assistant:

uint64_t ReadDWARFOffset(std::string_view* data) const {
    return dwarf64_ ? ReadFixed<uint64_t>(data) : ReadFixed<uint32_t>(data);
  }